

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ReusableStringStream::~ReusableStringStream(ReusableStringStream *this)

{
  ostream *poVar1;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar2;
  long *local_38 [2];
  long local_28 [2];
  
  (this->super_NonCopyable)._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001a12d8;
  poVar1 = this->m_oss;
  local_38[0] = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_38,"");
  std::__cxx11::stringbuf::str((string *)(poVar1 + 8));
  if (local_38[0] != local_28) {
    operator_delete(local_38[0],local_28[0] + 1);
  }
  std::ios::clear((int)this->m_oss + (int)*(undefined8 *)(*(long *)this->m_oss + -0x18));
  pSVar2 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  StringStreams::release(&pSVar2->super_StringStreams,this->m_index);
  return;
}

Assistant:

ReusableStringStream::~ReusableStringStream() {
        static_cast<std::ostringstream*>( m_oss )->str("");
        m_oss->clear();
        Singleton<StringStreams>::getMutable().release( m_index );
    }